

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::Set_partition_iterator
          (Set_partition_iterator *this,uint *n,uint *k)

{
  uint uVar1;
  value_type vVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  uint local_4c;
  uint local_48;
  uint i_2;
  uint j;
  uint i_1;
  uint i;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_21;
  uint *local_20;
  uint *k_local;
  uint *n_local;
  Set_partition_iterator *this_local;
  
  uVar3 = *k;
  local_20 = k;
  k_local = n;
  n_local = (uint *)this;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_21);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->value_,(ulong)uVar3,&local_21);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_21);
  uVar3 = *k_local;
  i = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->rgs_,(ulong)uVar3,&i,(allocator<unsigned_int> *)((long)&i_1 + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 3));
  uVar1 = *k_local;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_1 + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->max_,(ulong)(uVar1 + 1),(allocator<unsigned_int> *)((long)&i_1 + 2));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_1 + 2));
  this->is_end_ = *k_local == 0;
  this->n_ = *k_local;
  this->k_ = *local_20;
  uVar3 = std::numeric_limits<unsigned_int>::max();
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->max_,0);
  *pvVar4 = uVar3;
  for (j = 0; j <= *k_local - *local_20; j = j + 1) {
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->value_,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar5,&j);
  }
  i_2 = *k_local - *local_20;
  local_48 = 1;
  while (i_2 = i_2 + 1, i_2 < *k_local) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->rgs_,(ulong)i_2);
    *pvVar4 = local_48;
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->value_,(ulong)local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar5,&i_2);
    local_48 = local_48 + 1;
  }
  for (local_4c = 1; local_4c <= *k_local; local_4c = local_4c + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->rgs_,(ulong)(local_4c - 1));
    vVar2 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->max_,(ulong)local_4c);
    *pvVar4 = vVar2 + 1;
  }
  update_value(this);
  return;
}

Assistant:

Set_partition_iterator(const uint& n, const uint& k)
      : value_(k), rgs_(n, 0), max_(n + 1), is_end_(n == 0), n_(n), k_(k) {
    max_[0] = std::numeric_limits<uint>::max();
    for (uint i = 0; i <= n - k; ++i) value_[0].push_back(i);
    for (uint i = n - k + 1, j = 1; i < n; ++i, ++j) {
      rgs_[i] = j;
      value_[j].push_back(i);
    }
    for (uint i = 1; i <= n; i++) max_[i] = rgs_[i - 1] + 1;
    update_value();
  }